

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,Var value)

{
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  DynamicTypeHandler *pDVar4;
  RootObjectInlineCache *this;
  Type TVar5;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01436260,FixDataPropsPhase);
  if (bVar1) {
    return true;
  }
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    pTVar3 = (instance->super_RecyclableObject).type.ptr;
    TVar5 = pTVar3->typeId;
    if (TVar5 == TypeIds_GlobalObject) {
      bVar1 = ScriptContext::IsIntConstPropertyOnGlobalObject
                        ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                         scriptContext.ptr,propertyRecord->pid);
      if (bVar1) {
        return true;
      }
      pTVar3 = (instance->super_RecyclableObject).type.ptr;
      TVar5 = pTVar3->typeId;
    }
    if ((TVar5 == TypeIds_Object) &&
       (bVar1 = ScriptContext::IsIntConstPropertyOnGlobalUserObject
                          ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                           scriptContext.ptr,propertyRecord->pid), bVar1)) {
      return true;
    }
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01447bf0,FixDataVarPropsPhase);
  if (bVar1) {
    pDVar4 = DynamicObject::GetTypeHandler(instance);
    if ((pDVar4->flags & 0x20) != 0) {
      return true;
    }
    if (((instance->super_RecyclableObject).type.ptr)->typeId == TypeIds_GlobalObject) {
      this = RootObjectBase::GetRootInlineCache
                       ((RootObjectBase *)instance,propertyRecord,false,true);
      uVar2 = RootObjectInlineCache::Release(this);
      return uVar2 < 2;
    }
  }
  return false;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, Var value)
    {
        if (PHASE_FORCE1(Js::FixDataPropsPhase))
        {
            return true;
        }

        if (Js::TaggedInt::Is(value) &&
            ((instance->GetTypeId() == TypeIds_GlobalObject && instance->GetScriptContext()->IsIntConstPropertyOnGlobalObject(propertyRecord->GetPropertyId())) ||
            (instance->GetTypeId() == TypeIds_Object && instance->GetScriptContext()->IsIntConstPropertyOnGlobalUserObject(propertyRecord->GetPropertyId()))))
        {
            return true;
        }

        // Disabled by default
        if (PHASE_ON1(Js::FixDataVarPropsPhase))
        {
            if (instance->GetTypeHandler()->GetFlags() & IsPrototypeFlag)
            {
                return true;
            }
            if (instance->GetType()->GetTypeId() == TypeIds_GlobalObject)
            {
                // if we have statically seen multiple stores - we should not do this optimization
                RootObjectInlineCache* cache = (static_cast<Js::RootObjectBase*>(instance))->GetRootInlineCache(propertyRecord, /*isLoadMethod*/ false, /*isStore*/ true);
                uint refCount = cache->Release();
                return refCount <= 1;
            }
        }
        return false;
    }